

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void __thiscall Draw::PrintUi(Draw *this,GameData *Data,bool flagQuit,bool flagGameOver)

{
  int iVar1;
  ostream *poVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  bool flagGameOver_local;
  bool flagQuit_local;
  GameData *Data_local;
  Draw *this_local;
  
  std::operator<<((ostream *)&std::cout,"            HAPPY!     SCORE: ");
  iVar1 = GameData::GetScore(Data);
  PrintNumAlignCenter(this,iVar1,6,true);
  std::operator<<((ostream *)&std::cout,"     BEST: ");
  iVar1 = GameData::GetBestScore(Data);
  PrintNumAlignCenter(this,iVar1,6,true);
  poVar2 = std::operator<<((ostream *)&std::cout,"     !HAPPY");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "            ----------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "                       |------|------|------|------|");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    std::operator<<((ostream *)&std::cout,"                       |");
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      iVar1 = GameData::GetPositionNumber(Data,local_20,local_24);
      PrintNumAlignCenter(this,iVar1,6,false);
      std::operator<<((ostream *)&std::cout,"|");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "                       |------|------|------|------|");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "            ----------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (flagGameOver) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "                Do you want to play the game again?([Y]/[N])              "
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (flagQuit) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "                Do you really want to quite the game?([Y]/[N])            "
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Draw::PrintUi(GameData Data, bool flagQuit, bool flagGameOver) {
    std::cout << "            HAPPY!     SCORE: ";
    PrintNumAlignCenter(Data.GetScore(), 6, true);
    std::cout << "     BEST: ";
    PrintNumAlignCenter(Data.GetBestScore(), 6, true);
    std::cout << "     !HAPPY" << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    std::cout << std::endl << std::endl;
    std::cout << "                       |------|------|------|------|" << std::endl;

    for (int i = 0; i < 4; i++) {
        std::cout << "                       |";
        for (int j = 0; j < 4; j++) {
            PrintNumAlignCenter(Data.GetPositionNumber(i, j), 6, false);
            std::cout << ("|");
        }
        std::cout << std::endl;
        std::cout << "                       |------|------|------|------|" << std::endl;
    }

    std::cout << std::endl << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    if (flagGameOver)
        std::cout << "                Do you want to play the game again?([Y]/[N])              " << std::endl;
    else if (flagQuit)
        std::cout << "                Do you really want to quite the game?([Y]/[N])            " << std::endl;
    else
        std::cout << "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT" << std::endl;
}